

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_subroutine_body(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Parser *local_10;
  Parser *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"{",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"parameter list",&local_69)
  ;
  check_expected_x_after_y(this,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t<symbol>{</symbol>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  query_tokenizer(this);
  while( true ) {
    bVar1 = std::operator==(&this->cur_token,"var");
    if (!bVar1) break;
    parse_var_dec(this);
  }
  parse_statements(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"}",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"statement(s)",&local_b9);
  check_expected_x_after_y(this,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  poVar2 = (ostream *)this->out_file;
  std::operator+(&local_100,"\t\t<symbol>",&this->cur_token);
  std::operator+(&local_e0,&local_100,"</symbol>");
  poVar2 = std::operator<<(poVar2,(string *)&local_e0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  query_tokenizer(this);
  return;
}

Assistant:

void Parser::parse_subroutine_body() {
    check_expected_x_after_y("{", "parameter list");

    out_file << "\t\t<symbol>{</symbol>" << std::endl;
    query_tokenizer();

   while (cur_token == "var") {
        parse_var_dec();
    }
    parse_statements();

    check_expected_x_after_y("}", "statement(s)");
    out_file << "\t\t<symbol>" + cur_token + "</symbol>" << std::endl;
    query_tokenizer();

}